

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  xmlRelaxNGValidStatePtr pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  ulong uVar11;
  xmlChar *pxVar12;
  xmlRelaxNGValidErr err;
  byte *pbVar13;
  xmlRelaxNGDefinePtr_conflict pxVar14;
  byte *cur;
  byte *pbVar7;
  
  pxVar8 = ctxt->state;
  cur = pxVar8->value;
LAB_00189f75:
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    if (cur == (byte *)0x0) {
      return 0;
    }
    if (*cur == 0) {
      return 0;
    }
    while( true ) {
      uVar11 = (ulong)*cur;
      if (0x20 < uVar11) {
        return -1;
      }
      if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
      cur = cur + 1;
    }
    if (uVar11 != 0) {
      return -1;
    }
    return 0;
  default:
    goto switchD_00189f85_caseD_1;
  case XML_RELAXNG_EXCEPT:
    pxVar14 = define->content;
    while( true ) {
      if (pxVar14 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14);
      if (iVar3 == 0) break;
      pxVar14 = pxVar14->next;
    }
    return -1;
  case XML_RELAXNG_TEXT:
    goto switchD_00189f85_caseD_3;
  case XML_RELAXNG_DATATYPE:
    iVar3 = xmlRelaxNGValidateDatatype(ctxt,cur,define,pxVar8->seq);
    break;
  case XML_RELAXNG_VALUE:
    iVar4 = xmlStrEqual(cur,define->value);
    iVar3 = 0;
    if (iVar4 == 0) {
      if (define->name == (xmlChar *)0x0) {
        pxVar9 = xmlRelaxNGNormalize(ctxt,define->value);
        pxVar10 = xmlRelaxNGNormalize(ctxt,cur);
        if ((pxVar9 == (xmlChar *)0x0) || (pxVar10 == (xmlChar *)0x0)) {
LAB_0018a3c8:
          iVar3 = -1;
        }
        else {
          iVar4 = xmlStrEqual(pxVar9,pxVar10);
          iVar3 = 0;
          if (iVar4 == 0) goto LAB_0018a3c8;
        }
        if (pxVar9 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar9);
        }
        if (pxVar10 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar10);
        }
      }
      else {
        pvVar2 = define->data;
        iVar3 = -1;
        if ((pvVar2 != (void *)0x0) && (*(code **)((long)pvVar2 + 0x20) != (code *)0x0)) {
          iVar3 = (**(code **)((long)pvVar2 + 0x20))
                            (*(undefined8 *)((long)pvVar2 + 8),define->name,define->value,
                             define->node,define->attrs,cur,ctxt->state->node);
        }
        if (iVar3 < 0) {
          xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPECMP,define->name,(xmlChar *)0x0,0);
          return -1;
        }
        iVar3 = -(uint)(iVar3 != 1);
      }
    }
    break;
  case XML_RELAXNG_LIST:
    pxVar14 = define->content;
    pxVar9 = pxVar8->endvalue;
    pbVar5 = xmlStrdup(cur);
    if (pbVar5 == (byte *)0x0) {
      pbVar5 = xmlStrdup("");
    }
    pbVar6 = pbVar5;
    if (pbVar5 != (byte *)0x0) goto LAB_0018a143;
    err = XML_RELAXNG_ERR_NOSTATE;
    goto LAB_00189f98;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_GROUP:
    pxVar14 = define->content;
    while( true ) {
      if (pxVar14 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14);
      if (iVar3 != 0) break;
      pxVar14 = pxVar14->next;
    }
    return -1;
  case XML_RELAXNG_REF:
  case XML_RELAXNG_PARENTREF:
    goto switchD_00189f85_caseD_b;
  case XML_RELAXNG_OPTIONAL:
    if (cur == (byte *)0x0) {
      return 0;
    }
    if (*cur == 0) {
      return 0;
    }
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    iVar3 = xmlRelaxNGValidateValue(ctxt,define->content);
    ctxt->flags = uVar1;
    if (iVar3 != 0) {
      ctxt->state->value = cur;
    }
    goto LAB_0018a42e;
  case XML_RELAXNG_ZEROORMORE:
    goto switchD_00189f85_caseD_f;
  case XML_RELAXNG_ONEORMORE:
    pxVar14 = define->content;
    while ((iVar3 = 0, pxVar14 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
           (iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14), iVar3 == 0))) {
      pxVar14 = pxVar14->next;
    }
    if (iVar3 != 0) {
      return iVar3;
    }
switchD_00189f85_caseD_f:
    pxVar9 = ctxt->state->value;
    if (pxVar9 == (xmlChar *)0x0) {
      return 0;
    }
    if (*pxVar9 == '\0') {
      return 0;
    }
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    pxVar8 = ctxt->state;
    if (pxVar8->value != (xmlChar *)0x0) {
      pxVar9 = pxVar8->value;
      pxVar10 = (xmlChar *)0x0;
      do {
        pxVar12 = pxVar9;
        if ((pxVar10 == pxVar12) || (pxVar12 == pxVar8->endvalue)) break;
        for (pxVar14 = define->content; pxVar14 != (xmlRelaxNGDefinePtr_conflict)0x0;
            pxVar14 = pxVar14->next) {
          iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14);
          if (iVar3 != 0) {
            if (pxVar14 != (xmlRelaxNGDefinePtr_conflict)0x0) {
              ctxt->state->value = pxVar12;
              goto LAB_0018a427;
            }
            break;
          }
        }
        pxVar8 = ctxt->state;
        pxVar9 = pxVar8->value;
        pxVar10 = pxVar12;
      } while (pxVar8->value != (xmlChar *)0x0);
    }
LAB_0018a427:
    ctxt->flags = uVar1;
LAB_0018a42e:
    if (ctxt->errNr < 1) {
      return 0;
    }
    goto LAB_0018a436;
  case XML_RELAXNG_CHOICE:
    pxVar14 = define->content;
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    iVar3 = 0;
    while ((iVar4 = iVar3, pxVar14 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
           (iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14), iVar4 = 0, iVar3 != 0))) {
      ctxt->state->value = cur;
      pxVar14 = pxVar14->next;
    }
    ctxt->flags = uVar1;
    if (iVar4 != 0) {
      if ((uVar1 & 1) != 0) {
        return iVar4;
      }
      xmlRelaxNGDumpValidError(ctxt);
      return iVar4;
    }
    if (ctxt->errNr < 1) {
      return 0;
    }
LAB_0018a436:
    xmlRelaxNGPopErrors(ctxt,0);
    return 0;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  xmlRelaxNGNextValue(ctxt);
switchD_00189f85_caseD_3:
  return 0;
switchD_00189f85_caseD_b:
  define = define->content;
  if (define == (xmlRelaxNGDefinePtr)0x0) {
    err = XML_RELAXNG_ERR_NODEFINE;
LAB_00189f98:
    xmlRelaxNGAddValidError(ctxt,err,(xmlChar *)0x0,(xmlChar *)0x0,0);
switchD_00189f85_caseD_1:
    return -1;
  }
  goto LAB_00189f75;
LAB_0018a143:
  uVar11 = (ulong)*pbVar6;
  if (0x20 < uVar11) {
LAB_0018a16f:
    pbVar6 = pbVar6 + 1;
    goto LAB_0018a143;
  }
  pbVar7 = pbVar6;
  if ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0) {
    do {
      pbVar6 = pbVar7 + 1;
      *pbVar7 = 0;
      if (0x20 < (ulong)*pbVar6) break;
      pbVar7 = pbVar6;
    } while ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0);
    goto LAB_0018a143;
  }
  if (uVar11 != 0) goto LAB_0018a16f;
  pxVar8 = ctxt->state;
  pxVar8->endvalue = pbVar6;
  pbVar7 = pbVar5;
  do {
    pbVar13 = pbVar7;
    if (pbVar13 == pbVar6) break;
    pbVar7 = pbVar13 + 1;
  } while (*pbVar13 == 0);
  pxVar8->value = pbVar13;
  for (; iVar3 = 0, pxVar14 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar14 = pxVar14->next) {
    pxVar8 = ctxt->state;
    if (pxVar8->value == pxVar8->endvalue) {
      pxVar8->value = (xmlChar *)0x0;
    }
    iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar14);
    if (iVar3 != 0) break;
  }
  if (iVar3 == 0) {
    pxVar10 = ctxt->state->value;
    iVar3 = 0;
    if ((pxVar10 != (xmlChar *)0x0) && (pxVar10 != ctxt->state->endvalue)) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_LISTEXTRA,pxVar10,(xmlChar *)0x0,0);
      iVar3 = -1;
    }
  }
  (*xmlFree)(pbVar5);
  pxVar8 = ctxt->state;
  pxVar8->value = cur;
  pxVar8->endvalue = pxVar9;
  return iVar3;
}

Assistant:

static int
xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,
                        xmlRelaxNGDefinePtr define)
{
    int ret = 0, oldflags;
    xmlChar *value;

    value = ctxt->state->value;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:{
                if ((value != NULL) && (value[0] != 0)) {
                    int idx = 0;

                    while (IS_BLANK_CH(value[idx]))
                        idx++;
                    if (value[idx] != 0)
                        ret = -1;
                }
                break;
            }
        case XML_RELAXNG_TEXT:
            break;
        case XML_RELAXNG_VALUE:{
                if (!xmlStrEqual(value, define->value)) {
                    if (define->name != NULL) {
                        xmlRelaxNGTypeLibraryPtr lib;

                        lib = (xmlRelaxNGTypeLibraryPtr) define->data;
                        if ((lib != NULL) && (lib->comp != NULL)) {
                            ret = lib->comp(lib->data, define->name,
                                            define->value, define->node,
                                            (void *) define->attrs,
                                            value, ctxt->state->node);
                        } else
                            ret = -1;
                        if (ret < 0) {
                            VALID_ERR2(XML_RELAXNG_ERR_TYPECMP,
                                       define->name);
                            return (-1);
                        } else if (ret == 1) {
                            ret = 0;
                        } else {
                            ret = -1;
                        }
                    } else {
                        xmlChar *nval, *nvalue;

                        /*
                         * TODO: trivial optimizations are possible by
                         * computing at compile-time
                         */
                        nval = xmlRelaxNGNormalize(ctxt, define->value);
                        nvalue = xmlRelaxNGNormalize(ctxt, value);

                        if ((nval == NULL) || (nvalue == NULL) ||
                            (!xmlStrEqual(nval, nvalue)))
                            ret = -1;
                        if (nval != NULL)
                            xmlFree(nval);
                        if (nvalue != NULL)
                            xmlFree(nvalue);
                    }
                }
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);
                break;
            }
        case XML_RELAXNG_DATATYPE:{
                ret = xmlRelaxNGValidateDatatype(ctxt, value, define,
                                                 ctxt->state->seq);
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);

                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue;

                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;

                oldvalue = ctxt->state->value;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        break;
                    }
                    ctxt->state->value = oldvalue;
                    list = list->next;
                }
                ctxt->flags = oldflags;
                if (ret != 0) {
                    if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                        xmlRelaxNGDumpValidError(ctxt);
                } else {
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                }
                break;
            }
        case XML_RELAXNG_LIST:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue, *oldend, *val, *cur;

                oldvalue = ctxt->state->value;
                oldend = ctxt->state->endvalue;

                val = xmlStrdup(oldvalue);
                if (val == NULL) {
                    val = xmlStrdup(BAD_CAST "");
                }
                if (val == NULL) {
                    VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                    return (-1);
                }
                cur = val;
                while (*cur != 0) {
                    if (IS_BLANK_CH(*cur)) {
                        *cur = 0;
                        cur++;
                        while (IS_BLANK_CH(*cur))
                            *cur++ = 0;
                    } else
                        cur++;
                }
                ctxt->state->endvalue = cur;
                cur = val;
                while ((*cur == 0) && (cur != ctxt->state->endvalue))
                    cur++;

                ctxt->state->value = cur;

                while (list != NULL) {
                    if (ctxt->state->value == ctxt->state->endvalue)
                        ctxt->state->value = NULL;
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        break;
                    }
                    list = list->next;
                }

                if ((ret == 0) && (ctxt->state->value != NULL) &&
                    (ctxt->state->value != ctxt->state->endvalue)) {
                    VALID_ERR2(XML_RELAXNG_ERR_LISTEXTRA,
                               ctxt->state->value);
                    ret = -1;
                }
                xmlFree(val);
                ctxt->state->value = oldvalue;
                ctxt->state->endvalue = oldend;
                break;
            }
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGValidateValueList(ctxt, define->content);
            if (ret != 0) {
                break;
            }
            /* Falls through. */
        case XML_RELAXNG_ZEROORMORE:{
                xmlChar *cur, *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                cur = ctxt->state->value;
                temp = NULL;
                while ((cur != NULL) && (cur != ctxt->state->endvalue) &&
                       (temp != cur)) {
                    temp = cur;
                    ret =
                        xmlRelaxNGValidateValueList(ctxt, define->content);
                    if (ret != 0) {
                        ctxt->state->value = temp;
                        ret = 0;
                        break;
                    }
                    cur = ctxt->state->value;
                }
                ctxt->flags = oldflags;
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_OPTIONAL:{
                xmlChar *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                temp = ctxt->state->value;
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
                ctxt->flags = oldflags;
                if (ret != 0) {
                    ctxt->state->value = temp;
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                    ret = 0;
                    break;
                }
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_EXCEPT:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_PARENTREF:
	    if (define->content == NULL) {
                VALID_ERR(XML_RELAXNG_ERR_NODEFINE);
                ret = -1;
	    } else {
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
            }
            break;
        default:
            /* TODO */
            ret = -1;
    }
    return (ret);
}